

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O0

void av1_calc_indices_dim2_c
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *dist,int n,int k)

{
  int iVar1;
  long *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  int16_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int this_dist;
  int j;
  int min_dist;
  int i;
  int local_34;
  int local_30;
  int local_2c;
  
  if (in_RCX != (long *)0x0) {
    *in_RCX = 0;
  }
  for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
    local_30 = calc_dist_dim2((int16_t *)(in_RDI + (long)(local_2c << 1) * 2),in_RSI);
    *(undefined1 *)(CONCAT71(in_register_00000011,in_DL) + (long)local_2c) = 0;
    for (local_34 = 1; local_34 < in_R9D; local_34 = local_34 + 1) {
      iVar1 = calc_dist_dim2((int16_t *)(in_RDI + (long)(local_2c << 1) * 2),
                             in_RSI + (local_34 << 1));
      if (iVar1 < local_30) {
        *(char *)(CONCAT71(in_register_00000011,in_DL) + (long)local_2c) = (char)local_34;
        local_30 = iVar1;
      }
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = (long)local_30 + *in_RCX;
    }
  }
  return;
}

Assistant:

void RENAME_C(av1_calc_indices)(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *dist, int n, int k) {
  if (dist) {
    *dist = 0;
  }
  for (int i = 0; i < n; ++i) {
    int min_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM, centroids);
    indices[i] = 0;
    for (int j = 1; j < k; ++j) {
      const int this_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM,
                                              centroids + j * AV1_K_MEANS_DIM);
      if (this_dist < min_dist) {
        min_dist = this_dist;
        indices[i] = j;
      }
    }
    if (dist) {
#if AV1_K_MEANS_DIM == 1
      *dist += min_dist * min_dist;
#else
      *dist += min_dist;
#endif
    }
  }
}